

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateSourcesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmTarget *this_00;
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  allocator local_71;
  string prepro;
  string local_50;
  
  if (preprocessRule == InstallInterface) {
    this_00 = tei->Target;
    std::__cxx11::string::string((string *)&prepro,"INTERFACE_SOURCES",(allocator *)&local_50);
    pcVar2 = cmTarget::GetProperty(this_00,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    if (pcVar2 != (char *)0x0) {
      if (*pcVar2 == '\0') {
        std::__cxx11::string::string((string *)&prepro,"INTERFACE_SOURCES",(allocator *)&local_50);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prepro);
        std::__cxx11::string::assign((char *)pmVar3);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,pcVar2,&local_71);
        cmGeneratorExpression::Preprocess(&prepro,&local_50,InstallInterface,true);
        std::__cxx11::string::~string((string *)&local_50);
        if (prepro._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions
                    (this,&prepro,this_00,missingTargets,NoReplaceFreeTargets);
          std::__cxx11::string::string((string *)&local_50,"INTERFACE_SOURCES",&local_71);
          bVar1 = checkInterfaceDirs(&prepro,this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_50,"INTERFACE_SOURCES",&local_71);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_50);
            std::__cxx11::string::_M_assign((string *)pmVar3);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      std::__cxx11::string::~string((string *)&prepro);
    }
    return;
  }
  __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExportFileGenerator.cxx"
                ,0x180,
                "void cmExportFileGenerator::PopulateSourcesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
               );
}

Assistant:

void cmExportFileGenerator::PopulateSourcesInterface(
                      cmTargetExport *tei,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  cmTarget *target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char *propName = "INTERFACE_SOURCES";
  const char *input = target->GetProperty(propName);

  if (!input)
    {
    return;
    }

  if (!*input)
    {
    properties[propName] = "";
    return;
    }

  std::string prepro = cmGeneratorExpression::Preprocess(input,
                                                         preprocessRule,
                                                         true);
  if (!prepro.empty())
    {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName))
      {
      return;
      }
    properties[propName] = prepro;
    }
}